

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

double double_conversion::StrtodTrimmed(Vector<const_char> trimmed,int exponent)

{
  Vector<const_char> trimmed_00;
  int iVar1;
  uint64_t uVar2;
  DiyFp DVar3;
  int comparison;
  DiyFp upper_boundary;
  bool is_correct;
  double guess;
  int in_stack_00000364;
  DiyFp in_stack_00000368;
  Vector<const_char> in_stack_00000378;
  double in_stack_ffffffffffffff48;
  Double *this;
  Double *in_stack_ffffffffffffff58;
  Double *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  Double local_58;
  uint64_t local_50;
  int32_t local_48;
  undefined1 local_29;
  double local_28;
  double local_8;
  
  trimmed_00._8_8_ = in_stack_ffffffffffffff88;
  trimmed_00.start_ = in_stack_ffffffffffffff80;
  local_29 = ComputeGuess(trimmed_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          in_stack_ffffffffffffff70);
  if ((bool)local_29) {
    local_8 = local_28;
  }
  else {
    this = &local_58;
    Double::Double(this,in_stack_ffffffffffffff48);
    DVar3 = Double::UpperBoundary(this);
    local_50 = DVar3.f_;
    local_48 = DVar3.e_;
    iVar1 = CompareBufferWithDiyFp(in_stack_00000378,in_stack_00000364,in_stack_00000368);
    if (iVar1 < 0) {
      local_8 = local_28;
    }
    else if (iVar1 < 1) {
      Double::Double(this,in_stack_ffffffffffffff48);
      uVar2 = Double::Significand(in_stack_ffffffffffffff58);
      if ((uVar2 & 1) == 0) {
        local_8 = local_28;
      }
      else {
        Double::Double(this,in_stack_ffffffffffffff48);
        local_8 = Double::NextDouble(in_stack_ffffffffffffff68);
      }
    }
    else {
      Double::Double(this,in_stack_ffffffffffffff48);
      local_8 = Double::NextDouble(in_stack_ffffffffffffff68);
    }
  }
  return local_8;
}

Assistant:

double StrtodTrimmed(Vector<const char> trimmed, int exponent) {
  DOUBLE_CONVERSION_ASSERT(trimmed.length() <= kMaxSignificantDecimalDigits);
  DOUBLE_CONVERSION_ASSERT(AssertTrimmedDigits(trimmed));
  double guess;
  const bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) {
    return guess;
  }
  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}